

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree.cpp
# Opt level: O3

void __thiscall Segtree::unlazy(Segtree *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Segtree *pSVar4;
  Segtree *pSVar5;
  int iVar6;
  
  lVar3 = this->lazy;
  this->val = this->val + lVar3;
  iVar1 = this->l;
  iVar2 = this->r;
  if (iVar1 != iVar2) {
    pSVar4 = this->lson;
    if (pSVar4 == (Segtree *)0x0) {
      iVar6 = (iVar2 + iVar1) / 2;
      pSVar4 = (Segtree *)operator_new(0x30);
      pSVar4->INF = 1000000000000000000;
      pSVar4->l = iVar1;
      pSVar4->r = iVar6;
      pSVar4->val = 0;
      pSVar4->lazy = 0;
      pSVar4->lson = (Segtree *)0x0;
      pSVar4->rson = (Segtree *)0x0;
      this->lson = pSVar4;
      pSVar5 = (Segtree *)operator_new(0x30);
      pSVar5->INF = 1000000000000000000;
      pSVar5->l = iVar6;
      pSVar5->r = iVar2;
      pSVar5->val = 0;
      pSVar5->lazy = 0;
      pSVar5->lson = (Segtree *)0x0;
      pSVar5->rson = (Segtree *)0x0;
      this->rson = pSVar5;
    }
    else {
      pSVar5 = this->rson;
    }
    pSVar4->lazy = pSVar4->lazy + lVar3;
    pSVar5->lazy = pSVar5->lazy + this->lazy;
    this->lazy = 0;
  }
  return;
}

Assistant:

void unlazy() {
        val += lazy;
        if (l == r) return;
        if(lson == NULL) {
            int mid = (l+r)/2;
            lson = new Segtree(l, mid);
            rson = new Segtree(mid, r);
        }
        lson->lazy += lazy; // <- Propagate
        rson->lazy += lazy;
        lazy = 0;
    }